

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareCompresedTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,formatDefinition *format
          ,resolutionDefinition *resolution,bool mutability)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GLuint GVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  long lVar12;
  InternalError *this_00;
  uint __len;
  ulong uVar13;
  sockaddr *__addr;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iStack_40;
  int iStack_3c;
  long lVar11;
  
  __len = resolution->m_width;
  uVar8 = resolution->m_height;
  if ((int)resolution->m_height < (int)__len) {
    uVar8 = __len;
  }
  iVar14 = 1;
  if (1 < (int)uVar8) {
    uVar13 = (ulong)uVar8;
    do {
      uVar13 = uVar13 >> 1;
      iVar14 = iVar14 + 1;
      __len = (uint)uVar13;
      bVar7 = 3 < uVar8;
      uVar8 = __len;
    } while (bVar7);
  }
  GVar5 = resolution->m_depth;
  iVar9 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  textureDefinition::bind(texture,0x9009,__addr,__len);
  if (mutability) {
    uVar1 = resolution->m_width;
    uVar3 = resolution->m_height;
    auVar17._4_4_ = uVar3;
    auVar17._0_4_ = uVar1;
    auVar17._8_8_ = 0;
    iVar9 = 0;
    do {
      lVar12 = 0;
      while (((*(GLuint *)((long)&compressed_images[0].width + lVar12) != resolution->m_width ||
              (5 < GVar5 - 0xc)) ||
             ((*(GLuint *)((long)&compressed_images[0].height + lVar12) != resolution->m_height ||
              (*(int *)((long)&compressed_images[0].level + lVar12) != iVar9))))) {
        lVar12 = lVar12 + 0x20;
        if (lVar12 == 0x100) goto LAB_00d6ce8e;
      }
      lVar6 = *(long *)((long)&compressed_images[0].image_data + lVar12);
      if (lVar6 == 0) {
LAB_00d6ce8e:
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd65);
LAB_00d6cef0:
        __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar11 + 0x290))
                (0x9009,iVar9,(format->m_source).m_internal_format,auVar17._0_4_,auVar17._4_4_,
                 resolution->m_depth,0,
                 *(undefined4 *)((long)&compressed_images[0].image_size + lVar12),lVar6);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"compressedTexImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd6c);
      iStack_40 = auVar17._8_4_;
      iStack_3c = auVar17._12_4_;
      auVar15._0_4_ = auVar17._0_4_ / 2;
      auVar15._4_4_ = auVar17._4_4_ / 2;
      auVar15._8_4_ = iStack_40 / 2;
      auVar15._12_4_ = iStack_3c / 2;
      auVar18._0_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[0] < auVar15._0_4_);
      auVar18._4_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[1] < auVar15._4_4_);
      auVar18._8_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[2] < auVar15._8_4_);
      auVar18._12_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[3] < auVar15._12_4_);
      auVar17 = ~auVar18 &
                (undefined1  [16])
                GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                gather_offsets_y | auVar15 & auVar18;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar14);
  }
  else {
    (**(code **)(lVar11 + 0x1398))
              (0x9009,iVar14,(format->m_source).m_internal_format,resolution->m_width,
               resolution->m_height,resolution->m_depth);
    dVar10 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar10,"texStorage3D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0xd38);
    uVar2 = resolution->m_width;
    uVar4 = resolution->m_height;
    auVar19._4_4_ = uVar4;
    auVar19._0_4_ = uVar2;
    auVar19._8_8_ = 0;
    iVar9 = 0;
    do {
      lVar12 = 0;
      while ((((*(GLuint *)((long)&compressed_images[0].width + lVar12) != resolution->m_width ||
               (5 < GVar5 - 0xc)) ||
              (*(GLuint *)((long)&compressed_images[0].height + lVar12) != resolution->m_height)) ||
             (*(int *)((long)&compressed_images[0].level + lVar12) != iVar9))) {
        lVar12 = lVar12 + 0x20;
        if (lVar12 == 0x100) goto LAB_00d6cec0;
      }
      lVar6 = *(long *)((long)&compressed_images[0].image_data + lVar12);
      if (lVar6 == 0) {
LAB_00d6cec0:
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                   ,0xd47);
        goto LAB_00d6cef0;
      }
      (**(code **)(lVar11 + 0x2b0))
                (0x9009,iVar9,0,0,0,auVar19._0_4_,auVar19._4_4_,resolution->m_depth,
                 (format->m_source).m_internal_format,
                 *(undefined4 *)((long)&compressed_images[0].image_size + lVar12),lVar6);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"compressedTexSubImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                      ,0xd50);
      iStack_40 = auVar19._8_4_;
      iStack_3c = auVar19._12_4_;
      auVar16._0_4_ = auVar19._0_4_ / 2;
      auVar16._4_4_ = auVar19._4_4_ / 2;
      auVar16._8_4_ = iStack_40 / 2;
      auVar16._12_4_ = iStack_3c / 2;
      auVar20._0_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[0] < auVar16._0_4_);
      auVar20._4_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[1] < auVar16._4_4_);
      auVar20._8_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[2] < auVar16._8_4_);
      auVar20._12_4_ =
           -(uint)(GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                   gather_offsets_y[3] < auVar16._12_4_);
      auVar19 = ~auVar20 &
                (undefined1  [16])
                GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                gather_offsets_y | auVar16 & auVar20;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar14);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareCompresedTexture(const textureDefinition&	texture,
															  const formatDefinition&	 format,
															  const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint array_length	= resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);

		GLU_EXPECT_NO_ERROR(gl.getError(), "texStorage3D");

		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0, /* x_offset */
									   0,										   /* y offset */
									   0,										   /* z offset */
									   texture_width, texture_height, resolution.m_depth,
									   format.m_source.m_internal_format, image_size, image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexSubImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, format.m_source.m_internal_format,
									texture_width, texture_height, resolution.m_depth, 0 /* border */, image_size,
									image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
}